

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O0

void example3(Image *imageIn1,Image *imageIn2,Image *imageOut)

{
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  Image *in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_0000001c;
  Image *in_stack_00000020;
  uint32_t in_stack_00000030;
  Image croppedOut;
  Image *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  Image *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffe0;
  
  Image_Function::BitwiseOr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(uint32_t)((ulong)&stack0xffffffffffffffc0 >> 0x20),
             in_stack_ffffffffffffffe0,in_EDX,in_ESI);
  Image_Function::Copy
            (in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010,
             in_stack_0000000c,in_stack_00000008,in_stack_00000030,
             (uint32_t)croppedOut._vptr_ImageTemplate);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x102ad7);
  return;
}

Assistant:

void example3( const PenguinV_Image::Image & imageIn1, const PenguinV_Image::Image & imageIn2, PenguinV_Image::Image & imageOut )
{
    // Do Bitwise OR and store result in cropped output image (move operator)
    PenguinV_Image::Image croppedOut = Image_Function::BitwiseOr( imageIn1, // first input image
                                                                10,       // X coordinate of first input image area
                                                                10,       // Y coordinate of first input image area
                                                                imageIn2, // second input image
                                                                650,      // X coordinate of second input image area
                                                                768,      // Y coordinate of second input image area
                                                                128,      // width of the area
                                                                128       // height of the area
    );

    // Copy the result into output image
    Image_Function::Copy( croppedOut, // cropped output image
                          0,          // X coordinate where we get information from cropped output image
                          0,          // Y coordinate where we get information from cropped output image
                          imageOut,   // output image
                          0,          // X coordinate where we put information to output image
                          0,          // Y coordinate where we put information to output image
                          128,        // width of copying area
                          128         // height of copying area
    );
}